

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O2

int wally_asset_rangeproof
              (uint64_t value,uchar *pub_key,size_t pub_key_len,uchar *priv_key,size_t priv_key_len,
              uchar *asset,size_t asset_len,uchar *abf,size_t abf_len,uchar *vbf,size_t vbf_len,
              uchar *commitment,size_t commitment_len,uchar *extra,size_t extra_len,uchar *generator
              ,size_t generator_len,uint64_t min_value,int exp,int min_bits,uchar *bytes_out,
              size_t len,size_t *written)

{
  int iVar1;
  uchar nonce_hash [32];
  
  iVar1 = get_nonce_hash(pub_key,pub_key_len,priv_key,priv_key_len,nonce_hash,(size_t)asset);
  if (iVar1 == 0) {
    iVar1 = wally_asset_rangeproof_with_nonce
                      (value,nonce_hash,0x20,asset,asset_len,abf,abf_len,vbf,vbf_len,commitment,
                       commitment_len,extra,extra_len,generator,generator_len,min_value,exp,min_bits
                       ,bytes_out,len,written);
  }
  wally_clear(nonce_hash,0x20);
  return iVar1;
}

Assistant:

int wally_asset_rangeproof(uint64_t value,
                           const unsigned char *pub_key, size_t pub_key_len,
                           const unsigned char *priv_key, size_t priv_key_len,
                           const unsigned char *asset, size_t asset_len,
                           const unsigned char *abf, size_t abf_len,
                           const unsigned char *vbf, size_t vbf_len,
                           const unsigned char *commitment, size_t commitment_len,
                           const unsigned char *extra, size_t extra_len,
                           const unsigned char *generator, size_t generator_len,
                           uint64_t min_value, int exp, int min_bits,
                           unsigned char *bytes_out, size_t len,
                           size_t *written)
{
    unsigned char nonce_hash[SHA256_LEN];
    int ret;

    ret = get_nonce_hash(pub_key, pub_key_len, priv_key, priv_key_len,
                         nonce_hash, sizeof(nonce_hash));
    if (ret == WALLY_OK)
        ret = wally_asset_rangeproof_with_nonce(value,
                                                nonce_hash, sizeof(nonce_hash),
                                                asset, asset_len,
                                                abf, abf_len,
                                                vbf, vbf_len,
                                                commitment, commitment_len,
                                                extra, extra_len,
                                                generator, generator_len,
                                                min_value, exp, min_bits,
                                                bytes_out, len, written);

    wally_clear(nonce_hash, sizeof(nonce_hash));
    return ret;
}